

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

bool __thiscall LinearNE<2,_3,_0>::propagate(LinearNE<2,_3,_0> *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Lit *pLVar4;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  anon_union_8_2_743a5d44_for_Reason_0 local_40;
  
  if ((this->num_unfixed).v == 0) {
    if ((this->sum_fixed).v != 0) {
      return true;
    }
    if (so.lazy) {
      r._pt = Reason_new(this->sz + 1);
      lVar7 = 0;
      lVar10 = 0;
      while (lVar10 < this->sz) {
        iVar2 = (**(code **)(**(long **)((long)&this->x->var + lVar7) + 0x50))();
        lVar10 = lVar10 + 1;
        pLVar4 = Clause::operator[](r._pt,(int)lVar10);
        pLVar4->x = iVar2;
        lVar7 = lVar7 + 0x10;
      }
    }
    else {
      r._pt = (Clause *)0x0;
    }
    bVar1 = BoolView::setVal(&this->r,false,(Reason)r);
    return bVar1;
  }
  uVar8 = 0;
  lVar7 = 0;
  do {
    lVar6 = lVar7;
    lVar10 = *(long *)((long)&this->x->var + lVar6);
    lVar7 = lVar6 + 0x10;
    uVar8 = uVar8 - 1;
  } while (*(int *)(lVar10 + 0xc) == *(int *)(lVar10 + 0x10));
  iVar2 = *(int *)&(this->super_Propagator).field_0x14;
  iVar9 = (int)~uVar8;
  if (iVar9 < iVar2) {
    bVar1 = IntView<2>::indomain((IntView<2> *)((long)&this->x->var + lVar6),-(this->sum_fixed).v);
    if (bVar1) goto LAB_0018751b;
    iVar2 = *(int *)&(this->super_Propagator).field_0x14;
  }
  if (iVar9 < iVar2) {
    return true;
  }
  bVar1 = IntView<3>::indomain((IntView<3> *)((long)&this->y->var + lVar6),-(this->sum_fixed).v);
  if (!bVar1) {
    return true;
  }
LAB_0018751b:
  if (so.lazy == true) {
    local_40._pt = Reason_new(this->sz);
    lVar10 = 0;
    uVar5 = 0;
    while (~uVar8 != uVar5) {
      iVar2 = (**(code **)(**(long **)((long)&this->x->var + lVar10) + 0x50))();
      uVar5 = uVar5 + 1;
      pLVar4 = Clause::operator[](local_40._pt,(int)uVar5);
      pLVar4->x = iVar2;
      lVar10 = lVar10 + 0x10;
    }
    for (iVar2 = -(int)uVar8; iVar2 < this->sz; iVar2 = iVar2 + 1) {
      iVar3 = (**(code **)(**(long **)((long)&this->x->var + lVar7) + 0x50))();
      pLVar4 = Clause::operator[](local_40._pt,iVar2);
      pLVar4->x = iVar3;
      lVar7 = lVar7 + 0x10;
    }
  }
  else {
    local_40._pt = (Clause *)0x0;
  }
  if (iVar9 < *(int *)&(this->super_Propagator).field_0x14) {
    bVar1 = IntView<2>::remVal((IntView<2> *)((long)&this->x->var + lVar6),-(this->sum_fixed).v,
                               (Reason)local_40,true);
  }
  else {
    bVar1 = IntView<3>::remVal((IntView<3> *)((long)&this->y->var + lVar6),-(this->sum_fixed).v,
                               (Reason)local_40,true);
  }
  return bVar1 != false;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		assert(num_unfixed <= 1);

		if (num_unfixed == 0) {
			if (sum_fixed == 0) {
				Clause* m_r = nullptr;
				if (so.lazy) {
					m_r = Reason_new(sz + 1);
					for (int i = 0; i < sz; i++) {
						(*m_r)[i + 1] = x[i].getValLit();
					}
				}
				return r.setVal(false, m_r);
			}
			return true;
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		assert(num_unfixed == 1);

		int k = 0;
		while (x[k].isFixed()) {
			k++;
		}
		assert(k < sz);
		for (int i = k + 1; i < sz; i++) {
			assert(x[i].isFixed());
		}

		if ((k < sp && x[k].remValNotR(-sum_fixed)) || (k >= sp && y[k].remValNotR(-sum_fixed))) {
			Clause* m_r = nullptr;
			if (so.lazy) {
				m_r = Reason_new(sz + R);
				for (int i = 0; i < k; i++) {
					(*m_r)[i + 1] = x[i].getValLit();
				}
				for (int i = k + 1; i < sz; i++) {
					(*m_r)[i] = x[i].getValLit();
				}
				if (R != 0) {
					(*m_r)[sz] = r.getValLit();
				}
			}
			if (k < sp) {
				if (!x[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			} else {
				if (!y[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			}
		}

		return true;
	}